

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_message_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::javanano::RepeatedMessageFieldGenerator::GenerateFixClonedCode
          (RepeatedMessageFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->variables_,
                     "if (this.$name$ != null && this.$name$.length > 0) {\n  cloned.$name$ = new $type$[this.$name$.length];\n  for (int i = 0; i < this.$name$.length; i++) {\n    if (this.$name$[i] != null) {\n      cloned.$name$[i] = this.$name$[i].clone();\n    }\n  }\n}\n"
                    );
  return;
}

Assistant:

void RepeatedMessageFieldGenerator::
GenerateFixClonedCode(io::Printer* printer) const {
  printer->Print(variables_,
    "if (this.$name$ != null && this.$name$.length > 0) {\n"
    "  cloned.$name$ = new $type$[this.$name$.length];\n"
    "  for (int i = 0; i < this.$name$.length; i++) {\n"
    "    if (this.$name$[i] != null) {\n"
    "      cloned.$name$[i] = this.$name$[i].clone();\n"
    "    }\n"
    "  }\n"
    "}\n");
}